

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O1

string * pstore::logger::to_string<int>(string *__return_storage_ptr__,czstring message,int t)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  size_type *psVar5;
  ulong uVar6;
  uint __val;
  uint __len;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  __val = -t;
  if (0 < t) {
    __val = t;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar6;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_00138ede;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_00138ede;
      }
      if (uVar4 < 10000) goto LAB_00138ede;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_00138ede:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(t >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)t >> 0x1f) + (long)local_50[0]),__len,__val);
  strlen(message);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,(ulong)message);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string (gsl::czstring const message, T const t) {
                return message + std::to_string (t);
            }